

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReader.h
# Opt level: O1

void __thiscall
anurbs::DataReader::
fill_matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>
          (DataReader *this,string *key,
          Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *matrix)

{
  const_reference pvVar1;
  ulong uVar2;
  ulong uVar3;
  size_type idx;
  long lVar4;
  value_type row_data;
  value_type data;
  double ret;
  undefined1 local_58 [8];
  json_value local_50;
  undefined1 local_48 [8];
  json_value local_40;
  double local_38;
  
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(this->m_data,key);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_48,pvVar1);
  uVar2 = (ulong)local_48[0];
  if (local_48[0] != null) {
    if (local_48[0] == object) {
      uVar2 = ((local_40.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (local_48[0] == array) {
      uVar2 = (long)(((local_40.object)->m_keys)._M_h._M_bucket_count -
                    (long)((local_40.object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      uVar2 = 1;
    }
  }
  if (uVar2 != (matrix->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value) {
    __assert_fail("data.size() == matrix.rows()",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/DataReader.h"
                  ,0x3f,
                  "void anurbs::DataReader::fill_matrix(const std::string &, T) const [T = Eigen::Ref<Eigen::Matrix<double, -1, 3>>]"
                 );
  }
  lVar4 = 0;
  idx = 0;
  while( true ) {
    uVar2 = (ulong)local_48[0];
    if (local_48[0] != null) {
      if (local_48[0] == object) {
        uVar2 = ((local_40.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_48[0] == array) {
        uVar2 = (long)(((local_40.object)->m_keys)._M_h._M_bucket_count -
                      (long)((local_40.object)->m_keys)._M_h._M_buckets) >> 4;
      }
      else {
        uVar2 = 1;
      }
    }
    if ((long)uVar2 <= (long)idx) {
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_48);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_48 + 8),local_48[0]);
      return;
    }
    pvVar1 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_48,idx);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_58,pvVar1);
    uVar2 = (ulong)local_58[0];
    if (local_58[0] != null) {
      if (local_58[0] == object) {
        uVar2 = ((local_50.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_58[0] == array) {
        uVar2 = (long)(((local_50.object)->m_keys)._M_h._M_bucket_count -
                      (long)((local_50.object)->m_keys)._M_h._M_buckets) >> 4;
      }
      else {
        uVar2 = 1;
      }
    }
    if (uVar2 != 3) break;
    uVar2 = 0;
    while( true ) {
      uVar3 = (ulong)local_58[0];
      if (local_58[0] != null) {
        if (local_58[0] == object) {
          uVar3 = ((local_50.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        else if (local_58[0] == array) {
          uVar3 = (long)(((local_50.object)->m_keys)._M_h._M_bucket_count -
                        (long)((local_50.object)->m_keys)._M_h._M_buckets) >> 4;
        }
        else {
          uVar3 = 1;
        }
      }
      if ((long)uVar3 <= (long)uVar2) break;
      pvVar1 = nlohmann::
               basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_58,uVar2);
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (pvVar1,&local_38);
      if ((2 < uVar2) ||
         ((matrix->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value <= (long)idx)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x16d,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 3>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 3>>, Level = 1]"
                     );
      }
      *(double *)
       ((long)(matrix->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data +
       uVar2 * 8 +
       (matrix->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value * lVar4) = local_38;
      uVar2 = uVar2 + 1;
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_58);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
    idx = idx + 1;
    lVar4 = lVar4 + 8;
  }
  __assert_fail("row_data.size() == matrix.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/DataReader.h"
                ,0x44,
                "void anurbs::DataReader::fill_matrix(const std::string &, T) const [T = Eigen::Ref<Eigen::Matrix<double, -1, 3>>]"
               );
}

Assistant:

void fill_matrix(const std::string& key, T matrix) const
    {
        const auto data = m_data.at(key);
        
        assert(data.size() == matrix.rows());

        for (Index i = 0; i < length(data); i++) {
            const auto row_data = data.at(i);

            assert(row_data.size() == matrix.cols());

            for (Index j = 0; j < length(row_data); j++) {
                matrix(i, j) = row_data.at(j);
            }
        }
    }